

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

SampledSpectrum __thiscall
pbrt::ConductorBxDF::f(ConductorBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  float cosTheta_i;
  Float FVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar12 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 in_register_000012c4 [12];
  Vector3<float> VVar19;
  SampledSpectrum SVar20;
  SampledSpectrum F;
  Tuple3<pbrt::Vector3,_float> local_98;
  Tuple3<pbrt::Vector3,_float> local_88;
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  SampledSpectrum local_48;
  SampledSpectrum local_38;
  undefined1 auVar16 [56];
  
  local_38.values.values[3] = local_38.values.values[1];
  local_48.values.values[3] = local_48.values.values[1];
  local_88.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._8_56_ = wi._8_56_;
  auVar18._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._4_60_ = wo._12_60_;
  auVar13._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._8_56_ = wo._8_56_;
  auVar7._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_78._0_8_ = vmovlps_avx(auVar7._0_16_);
  local_88._0_8_ = vmovlps_avx(auVar18._0_16_);
  if (0.0 < auVar13._0_4_ * local_88.z) {
    auVar17 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                         ZEXT416((uint)(this->mfDistrib).alpha_x));
    if (auVar17._0_4_ < 0.001) {
      return (SampledSpectrum)(array<float,_4>)(ZEXT816(0) << 0x40);
    }
    auVar17._0_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.x + wo.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar17._4_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.y + wo.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar17._8_4_ =
         wi.super_Tuple3<pbrt::Vector3,_float>.z + wo.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar17._12_4_ = wi._12_4_ + wo._12_4_;
    local_98.z = auVar13._0_4_ + local_88.z;
    local_98._0_8_ = vmovlps_avx(auVar17);
    if ((auVar13._0_4_ != 0.0) || (NAN(auVar13._0_4_))) {
      if ((local_88.z == 0.0) && (!NAN(local_88.z))) {
        return (SampledSpectrum)(array<float,_4>)(ZEXT816(0) << 0x40);
      }
      if ((((local_98.z == 0.0) && (!NAN(local_98.z))) &&
          (uVar2 = vcmpps_avx512vl(auVar17,ZEXT816(0) << 0x40,0), (uVar2 & 1) != 0)) &&
         ((uVar2 >> 1 & 1) != 0)) {
        return (SampledSpectrum)(array<float,_4>)(ZEXT816(0) << 0x40);
      }
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      local_58 = vandps_avx(auVar13._0_16_,auVar6);
      auVar16 = ZEXT856(local_58._8_8_);
      auVar3._4_12_ = in_register_000012c4;
      auVar3._0_4_ = local_88.z;
      local_68 = vandps_avx(auVar3,auVar6);
      auVar12 = ZEXT856(local_68._8_8_);
      local_78.z = auVar13._0_4_;
      VVar19 = Normalize<float>((Vector3<float> *)&local_98);
      local_98.z = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar12;
      local_98._0_8_ = vmovlps_avx(auVar8._0_16_);
      local_48.values.values._0_12_ = ZEXT412(0x3f800000) << 0x40;
      VVar19 = FaceForward<float>((Vector3<float> *)&local_98,(Vector3<float> *)&local_48);
      auVar9._0_8_ = VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar9._8_56_ = auVar12;
      uVar1 = vmovlps_avx(auVar9._0_16_);
      local_38.values.values[2] = VVar19.super_Tuple3<pbrt::Vector3,_float>.z;
      local_38.values.values[0] = (float)(int)uVar1;
      local_38.values.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
      cosTheta_i = AbsDot<float>((Vector3<float> *)&local_88,(Vector3<float> *)&local_38);
      auVar12 = extraout_var;
      SVar20 = FrConductor(cosTheta_i,&this->eta,&this->k);
      auVar14._0_8_ = SVar20.values.values._8_8_;
      auVar14._8_56_ = auVar16;
      auVar10._0_8_ = SVar20.values.values._0_8_;
      auVar10._8_56_ = auVar12;
      local_38.values.values = (array<float,_4>)vmovlhps_avx(auVar10._0_16_,auVar14._0_16_);
      FVar4 = TrowbridgeReitzDistribution::D(&this->mfDistrib,(Vector3f *)&local_98);
      FVar5 = TrowbridgeReitzDistribution::G
                        (&this->mfDistrib,(Vector3f *)&local_78,(Vector3f *)&local_88);
      auVar12 = (undefined1  [56])0x0;
      SVar20 = SampledSpectrum::operator*(&local_38,FVar5 * FVar4);
      auVar15._0_8_ = SVar20.values.values._8_8_;
      auVar15._8_56_ = auVar16;
      auVar11._0_8_ = SVar20.values.values._0_8_;
      auVar11._8_56_ = auVar12;
      local_48.values.values = (array<float,_4>)vmovlhps_avx(auVar11._0_16_,auVar15._0_16_);
      SVar20 = SampledSpectrum::operator/
                         (&local_48,(float)local_68._0_4_ * 4.0 * (float)local_58._0_4_);
      return (array<float,_4>)SVar20.values.values;
    }
  }
  return (array<float,_4>)(array<float,_4>)(ZEXT816(0) << 0x40);
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (!SameHemisphere(wo, wi))
            return {};
        if (mfDistrib.EffectivelySpecular())
            return {};
        Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
        Vector3f wh = wi + wo;
        // Handle degenerate cases for microfacet reflection
        if (cosTheta_i == 0 || cosTheta_o == 0)
            return {};
        if (wh.x == 0 && wh.y == 0 && wh.z == 0)
            return {};

        wh = Normalize(wh);
        Float frCosTheta_i = AbsDot(wi, FaceForward(wh, Vector3f(0, 0, 1)));
        SampledSpectrum F = FrConductor(frCosTheta_i, eta, k);
        return mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F / (4 * cosTheta_i * cosTheta_o);
    }